

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O2

char * __thiscall Options::match_longopt(Options *this,char *opt,int len,int *ambiguous)

{
  char **ppcVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  char **optv;
  char **ppcVar5;
  int __c;
  ulong uVar6;
  int __c_00;
  char *pcVar7;
  OptionSpec optspec;
  OptionSpec local_58;
  char *local_48;
  int *local_40;
  long local_38;
  
  *ambiguous = 0;
  ppcVar5 = this->optvec;
  if ((ppcVar5 == (char **)0x0) || (pcVar4 = *ppcVar5, pcVar4 == (char *)0x0)) {
LAB_001ea071:
    pcVar7 = (char *)0x0;
  }
  else {
    local_38 = (long)len;
    pcVar7 = (char *)0x0;
    local_40 = ambiguous;
    while (pcVar4 != (char *)0x0) {
      OptionSpec::OptionSpec(&local_58,pcVar4);
      pcVar4 = OptionSpec::LongOpt(&local_58);
      if (pcVar4 != (char *)0x0) {
        if (pcVar4 == opt) {
LAB_001ea059:
          return local_58.spec + -(ulong)((byte)local_58._0_1_ & 1);
        }
        if (opt != (char *)0x0) {
          if (*pcVar4 == '\0') {
            if (*opt == '\0') goto LAB_001ea059;
          }
          else if (*opt != '\0') {
            local_48 = pcVar7;
            for (uVar6 = 0;
                ((int)local_38 == 0 || (long)uVar6 < local_38 &&
                (bVar2 = opt[uVar6], (bVar2 & 0xdf) != 0)); uVar6 = uVar6 + 1) {
              __c = (int)pcVar4[uVar6];
              iVar3 = isupper(__c);
              if (iVar3 != 0) {
                __c = tolower(__c);
              }
              __c_00 = (int)(char)bVar2;
              iVar3 = isupper(__c_00);
              if (iVar3 != 0) {
                __c_00 = tolower(__c_00);
              }
              pcVar7 = local_48;
              if (__c != __c_00) goto LAB_001ea04c;
            }
            if (pcVar4[uVar6 & 0xffffffff] == '\0') goto LAB_001ea059;
            if (local_48 != (char *)0x0) {
              *local_40 = *local_40 + 1;
              goto LAB_001ea071;
            }
            pcVar7 = local_58.spec + -(ulong)((byte)local_58._0_1_ & 1);
          }
        }
      }
LAB_001ea04c:
      ppcVar1 = ppcVar5 + 1;
      ppcVar5 = ppcVar5 + 1;
      pcVar4 = *ppcVar1;
    }
  }
  return pcVar7;
}

Assistant:

const char *
Options::match_longopt(const char * opt, int  len, int & ambiguous) const {
   kwdmatch_t  result;
   const char * matched = NULLSTR ;

   ambiguous = 0;
   if ((optvec == NULL) || (! *optvec))  return  NULLSTR;

   for (const char * const * optv = optvec ; *optv ; optv++) {
      OptionSpec  optspec = *optv;
      const char * longopt = optspec.LongOpt();
      if (longopt == NULL)  continue;
      result = kwdmatch(longopt, opt, len);
      if (result == EXACT_MATCH) {
         return  optspec;
      } else if (result == PARTIAL_MATCH) {
         if (matched) {
            ++ambiguous;
            return  NULLSTR;
         } else {
            matched = optspec;
         }
      }
   }//for

   return  matched;
}